

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MersenneTwister.h
# Opt level: O0

void __thiscall MTRand::reload(MTRand *this)

{
  uint32 uVar1;
  int local_1c;
  MTRand *pMStack_18;
  int i;
  uint32 *p;
  MTRand *this_local;
  
  local_1c = 0xe3;
  pMStack_18 = this;
  while (local_1c != 0) {
    uVar1 = twist(this,pMStack_18->state + 0x18d,pMStack_18->state,pMStack_18->state + 1);
    pMStack_18->state[0] = uVar1;
    pMStack_18 = (MTRand *)(pMStack_18->state + 1);
    local_1c = local_1c + -1;
  }
  local_1c = 0x18d;
  while (local_1c = local_1c + -1, local_1c != 0) {
    uVar1 = twist(this,pMStack_18[-1].state + 399,pMStack_18->state,pMStack_18->state + 1);
    pMStack_18->state[0] = uVar1;
    pMStack_18 = (MTRand *)(pMStack_18->state + 1);
  }
  uVar1 = twist(this,pMStack_18[-1].state + 399,pMStack_18->state,this->state);
  pMStack_18->state[0] = uVar1;
  this->left = 0x270;
  this->pNext = this->state;
  return;
}

Assistant:

inline void MTRand::reload()
{
	// Generate N new values in state
	// Made clearer and faster by Matthew Bellew (matthew.bellew@home.com)
	register uint32 *p = state;
	register int i;
	for( i = N - M; i--; ++p )
		*p = twist( p[M], p[0], p[1] );
	for( i = M; --i; ++p )
		*p = twist( p[M-N], p[0], p[1] );
	*p = twist( p[M-N], p[0], state[0] );

	left = N, pNext = state;
}